

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

void __thiscall
cmCTest::OutputTestErrors(cmCTest *this,vector<char,_std::allocator<char>_> *process_output)

{
  pointer pcVar1;
  ostream *poVar2;
  string test_outputs;
  ostringstream cmCTestLog_msg;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  long *local_1b0;
  long local_1a0 [2];
  undefined1 local_190 [376];
  
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"\n*** Test Failed:\n","");
  pcVar1 = (process_output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar1 != (process_output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)&local_1d0,(ulong)pcVar1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(char *)local_1d0,local_1c8);
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,2,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
      ,0xc7d,(char *)local_1b0,false);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  return;
}

Assistant:

void cmCTest::OutputTestErrors(std::vector<char> const& process_output)
{
  std::string test_outputs("\n*** Test Failed:\n");
  if (!process_output.empty()) {
    test_outputs.append(process_output.data(), process_output.size());
  }
  cmCTestLog(this, HANDLER_OUTPUT, test_outputs << std::endl << std::flush);
}